

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe_LPGTexture.cpp
# Opt level: O1

GMM_STATUS __thiscall
GmmLib::GmmXe_LPGTextureCalc::GetTexLockOffset
          (GmmXe_LPGTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo)

{
  GMM_RESOURCE_TYPE GVar1;
  long lVar2;
  uint8_t uVar3;
  anon_union_8_2_48ff183f_for_anon_struct_16_3_bc420dd9_for_Lock_0 aVar4;
  undefined4 extraout_var_00;
  anon_union_8_2_48ff183f_for_anon_struct_16_3_bc420dd9_for_Lock_0 aVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint32_t uVar10;
  uint local_4c;
  uint local_48;
  uint32_t MipHeight;
  uint32_t MipWidth;
  GMM_PLATFORM_INFO *local_38;
  undefined4 extraout_var;
  
  if (pReqInfo == (GMM_REQ_OFFSET_INFO *)0x0 || pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    return GMM_ERROR;
  }
  local_38 = GmmGetPlatformInfo((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                                super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.
                                super_GmmTextureCalc.pGmmLibContext);
  _MipWidth = pTexInfo->Pitch;
  uVar8 = pReqInfo->MipLevel;
  uVar10 = pReqInfo->Slice;
  uVar3 = GmmIsPlanar(pTexInfo->Format);
  if (uVar3 == '\0') {
    GVar1 = pTexInfo->Type;
    MipHeight = uVar10;
    if ((GVar1 - RESOURCE_1D < 2) || (GVar1 == RESOURCE_CUBE)) {
      aVar5._0_4_ = (*(this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                      super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                      _vptr_GmmTextureCalc[0x10])(this,pTexInfo,pReqInfo);
      aVar5.Offset64._4_4_ = extraout_var_00;
      uVar10 = (uint32_t)_MipWidth;
    }
    else {
      uVar10 = (uint32_t)_MipWidth;
      if (GVar1 == RESOURCE_3D) {
        if ((int)(local_38->Platform).eRenderCoreFamily < 0xc) {
          bVar6 = (byte)uVar8;
          local_4c = pTexInfo->BaseHeight >> (bVar6 & 0x1f);
          local_48 = (uint)pTexInfo->BaseWidth >> (bVar6 & 0x1f);
          local_38 = (GMM_PLATFORM_INFO *)(_MipWidth & 0xffffffff);
          GmmTextureCalc::AlignTexHeightWidth((GmmTextureCalc *)this,pTexInfo,&local_4c,&local_48);
          uVar9 = 1L << (bVar6 & 0x3f);
          lVar2 = *(long *)(pTexInfo->MmcHint + (ulong)uVar8 * 8 + 0x78);
          (pReqInfo->Lock).field_2 =
               *(anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3 *)
                &(pTexInfo->OffsetInfo).field_0;
          aVar5.Offset64 =
               (ulong)local_4c * (long)local_38 * ((ulong)MipHeight / (uVar9 & 0xffffffff)) + lVar2;
          uVar8 = (int)uVar9 - 1U & MipHeight;
          if (uVar8 != 0) {
            aVar5.Offset64 =
                 aVar5.Offset64 +
                 ((ulong)pTexInfo->BitsPerPixel * (ulong)local_48 * (ulong)uVar8 >> 3);
          }
        }
        else {
          aVar5._0_4_ = (*(this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                          super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                          _vptr_GmmTextureCalc[0x10])(this,pTexInfo,pReqInfo);
          aVar5.Offset64._4_4_ = 0;
          (pReqInfo->Lock).field_2 =
               *(anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3 *)
                &(pTexInfo->OffsetInfo).field_0;
        }
      }
      else {
        aVar5.Offset64 = 0;
      }
    }
    (pReqInfo->Lock).field_0 = aVar5;
    (pReqInfo->Lock).Pitch = uVar10;
  }
  else {
    aVar4._0_4_ = (*(this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                    super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                    _vptr_GmmTextureCalc[0x10])(this,pTexInfo,pReqInfo);
    aVar4.Offset64._4_4_ = extraout_var;
    (pReqInfo->Lock).field_0 = aVar4;
    uVar8 = (uint)_MipWidth;
    if ((pTexInfo->OffsetInfo).field_0.PlaneXe_LPG.Is1MBAuxTAlignedPlanes == true) {
      uVar8 = *(uint *)((long)&(pTexInfo->OffsetInfo).field_0 + 0x80);
    }
    (pReqInfo->Lock).Pitch = uVar8;
    if (((pReqInfo->Plane & ~GMM_PLANE_3D_Y1) == GMM_PLANE_3D_UV0) &&
       (uVar7 = pTexInfo->Format - GMM_FORMAT_I420, uVar7 < 0x27)) {
      if ((0x2000002003U >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
        if ((ulong)uVar7 != 0x26) {
          return GMM_SUCCESS;
        }
        uVar10 = uVar8 >> 2;
      }
      else {
        uVar10 = uVar8 >> 1;
      }
      (pReqInfo->Lock).Pitch = uVar10;
    }
  }
  return GMM_SUCCESS;
}

Assistant:

GMM_STATUS GmmLib::GmmXe_LPGTextureCalc::GetTexLockOffset(GMM_TEXTURE_INFO *   pTexInfo,
                                                          GMM_REQ_OFFSET_INFO *pReqInfo)
{
    GMM_STATUS     Result = GMM_SUCCESS;
    GMM_GFX_SIZE_T AddressOffset;
    uint32_t       Pitch, Slice;
    uint32_t       MipHeight, MipWidth, MipLevel;
    uint32_t       NumberOfMipsInSingleRow, SliceRow;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pReqInfo, GMM_ERROR);

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    // set default value
    AddressOffset = 0;
    Pitch         = GFX_ULONG_CAST(pTexInfo->Pitch);
    MipLevel      = pReqInfo->MipLevel;
    Slice         = pReqInfo->Slice;

    if(GmmIsPlanar(pTexInfo->Format))
    {
        AddressOffset           = GetMipMapByteAddress(pTexInfo, pReqInfo);
        pReqInfo->Lock.Offset64 = AddressOffset;
        pReqInfo->Lock.Pitch    = pTexInfo->OffsetInfo.PlaneXe_LPG.Is1MBAuxTAlignedPlanes ? GFX_ULONG_CAST(pTexInfo->OffsetInfo.PlaneXe_LPG.PhysicalPitch) : Pitch;

        // Adjust returned pitch for non-uniform-pitch U/V queries...
        if((pReqInfo->Plane == GMM_PLANE_U) ||
           (pReqInfo->Plane == GMM_PLANE_V))
        {
            switch(pTexInfo->Format)
            {
                case GMM_FORMAT_I420:
                case GMM_FORMAT_IYUV:
                case GMM_FORMAT_YV12:
                case GMM_FORMAT_NV11:
                    pReqInfo->Lock.Pitch /= 2;
                    break;
                case GMM_FORMAT_YVU9:
                    pReqInfo->Lock.Pitch /= 4;
                    break;
                default:
                    //Cool--Constant pitch across all planes.
                    break;
            }
        }

        return Result;
    }

    switch(pTexInfo->Type)
    {
        case RESOURCE_3D:
        {
            if(GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN9_CORE)
            {
                AddressOffset = GFX_ULONG_CAST(GetMipMapByteAddress(pTexInfo, pReqInfo));

                // Bytes from one slice to the next...
                pReqInfo->Lock.Gen9PlusSlicePitch = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock);
            }
            else
            {
                MipHeight = pTexInfo->BaseHeight >> MipLevel;
                MipWidth  = GFX_ULONG_CAST(pTexInfo->BaseWidth) >> MipLevel;

                AlignTexHeightWidth(pTexInfo, &MipHeight, &MipWidth);

                // See how many mip can fit in one row
                NumberOfMipsInSingleRow = GFX_2_TO_POWER_OF(MipLevel);

                SliceRow = Slice / NumberOfMipsInSingleRow;

                // get the base address + Slice pitch
                AddressOffset = pTexInfo->OffsetInfo.Texture3DOffsetInfo.Offset[MipLevel];

                pReqInfo->Lock.Mip0SlicePitch = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Texture3DOffsetInfo.Mip0SlicePitch);

                // Actual address is offset based on requested slice
                AddressOffset += (GMM_GFX_SIZE_T)SliceRow * MipHeight * Pitch;

                // Get to particular slice
                if(Slice % NumberOfMipsInSingleRow)
                {
                    AddressOffset += (((GMM_GFX_SIZE_T)(Slice % NumberOfMipsInSingleRow) *
                                       MipWidth * pTexInfo->BitsPerPixel) >>
                                      3);
                }
            }
            break;
        }
        case RESOURCE_CUBE:
        case RESOURCE_2D:
        case RESOURCE_1D:
        {
            AddressOffset = GetMipMapByteAddress(pTexInfo, pReqInfo);
            break;
        }
        default:
        { // These resources dont' have multiple levels of detail
            AddressOffset = 0;
            break;
        }
    }

    pReqInfo->Lock.Offset64 = AddressOffset;
    pReqInfo->Lock.Pitch    = Pitch;

    return Result;
}